

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

int __thiscall Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  int iVar2;
  sockaddr local_10;
  
  local_10.sa_data[6] = '\0';
  local_10.sa_data[7] = '\0';
  local_10.sa_data[8] = '\0';
  local_10.sa_data[9] = '\0';
  local_10.sa_data[10] = '\0';
  local_10.sa_data[0xb] = '\0';
  local_10.sa_data[0xc] = '\0';
  local_10.sa_data[0xd] = '\0';
  local_10.sa_family = 2;
  local_10.sa_data._0_2_ = (ushort)__addr << 8 | (ushort)__addr >> 8;
  uVar1 = 0;
  if (__fd != -1) {
    uVar1 = __fd;
  }
  local_10.sa_data._2_4_ =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  iVar2 = (int)CONCAT71((uint7)(uint3)((uint)local_10.sa_data._2_4_ >> 8),1);
  if ((int)__addr != 0 || uVar1 != 0) {
    iVar2 = ::bind(this->s,&local_10,0x10);
    iVar2 = CONCAT31((int3)((uint)iVar2 >> 8),-1 < iVar2);
  }
  return iVar2;
}

Assistant:

bool Socket::bind(uint32 ip, uint16 port)
{
  struct sockaddr_in sin;
  memset(&sin, 0, sizeof(sin));
  sin.sin_family = AF_INET;
  sin.sin_port = htons(port);
  sin.sin_addr.s_addr = htonl((ip == INADDR_NONE) ? INADDR_ANY : ip);

  if(sin.sin_addr.s_addr == htonl(INADDR_ANY) && port == 0)
    return true;

  if(::bind(s, (struct sockaddr*)&sin, sizeof(sin)) < 0)
    return false;
  return true;
}